

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::
         write_significand<char,fmt::v10::appender,unsigned_int,fmt::v10::detail::digit_grouping<char>>
                   (appender out,uint significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar1;
  format_decimal_result<fmt::v10::appender> fVar2;
  memory_buffer buffer;
  char local_231;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_230;
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    fVar2 = format_decimal<char,_unsigned_int,_fmt::v10::appender,_0>
                      (out,significand,significand_size);
    local_230.super_buffer<char>._vptr_buffer =
         (_func_int **)CONCAT71(local_230.super_buffer<char>._vptr_buffer._1_7_,0x30);
    bVar1.container =
         (buffer<char> *)
         fill_n<fmt::v10::appender,int,char>
                   (fVar2.end.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                    exponent,(char *)&local_230);
  }
  else {
    local_230.super_buffer<char>.ptr_ = local_230.store_;
    local_230.super_buffer<char>.size_ = 0;
    local_230.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_002a3a00;
    local_230.super_buffer<char>.capacity_ = 500;
    format_decimal<char,_unsigned_int,_fmt::v10::appender,_0>
              ((appender)&local_230,significand,significand_size);
    local_231 = '0';
    fill_n<fmt::v10::appender,int,char>((appender)&local_230,exponent,&local_231);
    digits.size_ = local_230.super_buffer<char>.size_;
    digits.data_ = local_230.super_buffer<char>.ptr_;
    bVar1.container =
         (buffer<char> *)digit_grouping<char>::apply<fmt::v10::appender,char>(grouping,out,digits);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_230);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}